

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qobject.cpp
# Opt level: O0

void QObject::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  undefined8 *puVar2;
  bool bVar3;
  void *pvVar4;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  QBindable<QString> QVar5;
  void *_v_1;
  void *_v;
  QObject *_r_1;
  QObject *_r;
  QObject *_t;
  QObject *in_stack_ffffffffffffff28;
  QObject *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff3c;
  QObject *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff54;
  code *in_stack_ffffffffffffff68;
  QObject *in_stack_ffffffffffffff80;
  QUntypedPropertyData *local_30;
  QBindableInterface *local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 4) {
    in_stack_ffffffffffffff54 = in_EDX;
    if (in_EDX == 0) {
      in_stack_ffffffffffffff48 = (QObject *)operator_new(0x10);
      QObject((QObject *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
              in_stack_ffffffffffffff48);
      if (*(long *)in_RCX != 0) {
        **(undefined8 **)in_RCX = in_stack_ffffffffffffff48;
      }
    }
    else if (in_EDX == 1) {
      pvVar4 = operator_new(0x10);
      QObject((QObject *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
              in_stack_ffffffffffffff48);
      if (*(long *)in_RCX != 0) {
        **(undefined8 **)in_RCX = pvVar4;
      }
    }
  }
  if (in_ESI == 10) {
    in_stack_ffffffffffffff3c = in_EDX;
    if (in_EDX == 0) {
      QObject((QObject *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
              in_stack_ffffffffffffff48);
    }
    else if (in_EDX == 1) {
      QObject((QObject *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
              in_stack_ffffffffffffff48);
    }
  }
  if (in_ESI == 0) {
    in_stack_ffffffffffffff30 = (QObject *)(ulong)in_EDX;
    switch(in_stack_ffffffffffffff30) {
    case (QObject *)0x0:
      destroyed((QObject *)0x3fa60d,in_stack_ffffffffffffff28);
      break;
    case (QObject *)0x1:
      destroyed((QObject *)0x3fa620,in_stack_ffffffffffffff28);
      break;
    case (QObject *)0x2:
      objectNameChanged(in_RDI,*(undefined8 *)(in_RCX + 8));
      break;
    case (QObject *)0x3:
      deleteLater(in_stack_ffffffffffffff80);
    }
  }
  if (in_ESI == 5) {
    bVar3 = QtMocHelpers::indexOfMethod<void(QObject::*)(QObject*)>(in_RCX,(void **)destroyed,0,0);
    if (bVar3) goto LAB_003fa7cd;
    in_stack_ffffffffffffff68 = objectNameChanged;
    bVar3 = QtMocHelpers::indexOfMethod<void(QObject::*)(QString_const&,QObject::QPrivateSignal)>
                      (in_RCX,(void **)objectNameChanged,0,2);
    if (bVar3) goto LAB_003fa7cd;
  }
  if ((in_ESI == 1) && (in_EDX == 0)) {
    objectName((QObject *)in_stack_ffffffffffffff68);
    QString::operator=((QString *)in_stack_ffffffffffffff30,(QString *)in_stack_ffffffffffffff28);
    QString::~QString((QString *)0x3fa72c);
  }
  if ((in_ESI == 2) && (in_EDX == 0)) {
    setObjectName<void>(in_stack_ffffffffffffff30,(QString *)in_stack_ffffffffffffff28);
  }
  if ((in_ESI == 8) && (in_EDX == 0)) {
    QVar5 = bindableObjectName((QObject *)
                               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    puVar2 = *(undefined8 **)in_RCX;
    local_30 = QVar5.super_QUntypedBindable.data;
    *puVar2 = local_30;
    local_28 = QVar5.super_QUntypedBindable.iface;
    puVar2[1] = local_28;
  }
LAB_003fa7cd:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QObject::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QObject *>(_o);
    if (_c == QMetaObject::CreateInstance) {
        switch (_id) {
        case 0: { QObject *_r = new QObject((*reinterpret_cast<std::add_pointer_t<QObject*>>(_a[1])));
            if (_a[0]) *reinterpret_cast<QObject**>(_a[0]) = _r; } break;
        case 1: { QObject *_r = new QObject();
            if (_a[0]) *reinterpret_cast<QObject**>(_a[0]) = _r; } break;
        default: break;
        }
    }
    if (_c == QMetaObject::ConstructInPlace) {
        switch (_id) {
        case 0: { new (_a[0]) QObject((*reinterpret_cast<std::add_pointer_t<QObject*>>(_a[1]))); } break;
        case 1: { new (_a[0]) QObject(); } break;
        default: break;
        }
    }
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->destroyed((*reinterpret_cast< std::add_pointer_t<QObject*>>(_a[1]))); break;
        case 1: _t->destroyed(); break;
        case 2: _t->objectNameChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])), QPrivateSignal()); break;
        case 3: _t->deleteLater(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QObject::*)(QObject * )>(_a, &QObject::destroyed, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QObject::*)(const QString & , QPrivateSignal)>(_a, &QObject::objectNameChanged, 2))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QString*>(_v) = _t->objectName(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setObjectName(*reinterpret_cast<QString*>(_v)); break;
        default: break;
        }
    }
    if (_c == QMetaObject::BindableProperty) {
        switch (_id) {
        case 0: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableObjectName(); break;
        default: break;
        }
    }
}